

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O3

void qsort_descent_inplace
               (vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects,int left,int right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float *pfVar11;
  Point2f *pPVar12;
  pointer pFVar13;
  int iVar14;
  ulong uVar15;
  Point2f *pPVar16;
  long lVar17;
  int left_00;
  ulong uVar18;
  pointer pFVar19;
  Point2f *pPVar20;
  ulong uVar21;
  pointer pFVar22;
  float *pfVar23;
  float *pfVar24;
  float afStack_6c [4];
  float afStack_5c [11];
  
  uVar18 = (ulong)(uint)left;
  pFVar13 = (faceobjects->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    left_00 = (int)uVar18;
    iVar14 = right;
    if (left_00 <= right) {
      fVar1 = pFVar13[(left_00 + right) / 2].prob;
      uVar15 = (ulong)(uint)right;
      do {
        uVar21 = (ulong)(int)uVar18;
        pPVar12 = pFVar13[uVar21].landmark;
        pfVar11 = &pFVar13[uVar21].landmark[0].y;
        do {
          pfVar23 = pfVar11;
          pPVar20 = pPVar12;
          uVar18 = uVar21;
          fVar2 = pFVar13[uVar18].prob;
          uVar21 = uVar18 + 1;
          pPVar12 = (Point2f *)&pPVar20[7].y;
          pfVar11 = pfVar23 + 0xf;
        } while (fVar1 < fVar2);
        pFVar19 = pFVar13 + uVar18;
        uVar21 = (ulong)(int)uVar15;
        pfVar11 = &pFVar13[uVar21].landmark[0].y;
        pPVar12 = pFVar13[uVar21].landmark;
        do {
          pPVar16 = pPVar12;
          pfVar24 = pfVar11;
          uVar15 = uVar21;
          fVar3 = pFVar13[uVar15].prob;
          uVar21 = uVar15 - 1;
          pfVar11 = pfVar24 + -0xf;
          pPVar12 = (Point2f *)&pPVar16[-8].y;
        } while (fVar3 < fVar1);
        if ((long)uVar18 <= (long)uVar15) {
          pFVar22 = pFVar13 + uVar15;
          fVar7 = (pFVar19->rect).x;
          fVar8 = (pFVar19->rect).y;
          fVar9 = (pFVar19->rect).width;
          fVar10 = (pFVar19->rect).height;
          lVar17 = 2;
          do {
            afStack_6c[lVar17 * 2] = ((Point2f *)(pfVar23 + -1))->x;
            afStack_6c[lVar17 * 2 + 1] = *pfVar23;
            lVar17 = lVar17 + 1;
            pfVar23 = pfVar23 + 2;
          } while (lVar17 != 7);
          afStack_5c[10] = fVar2;
          fVar4 = (pFVar22->rect).y;
          fVar5 = (pFVar22->rect).width;
          fVar6 = (pFVar22->rect).height;
          (pFVar19->rect).x = (pFVar22->rect).x;
          (pFVar19->rect).y = fVar4;
          (pFVar19->rect).width = fVar5;
          (pFVar19->rect).height = fVar6;
          lVar17 = 5;
          do {
            *pPVar20 = *pPVar16;
            pPVar16 = pPVar16 + 1;
            pPVar20 = pPVar20 + 1;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
          pFVar19->prob = fVar3;
          (pFVar22->rect).x = fVar7;
          (pFVar22->rect).y = fVar8;
          (pFVar22->rect).width = fVar9;
          (pFVar22->rect).height = fVar10;
          lVar17 = 2;
          do {
            ((Point2f *)(pfVar24 + -1))->x = afStack_6c[lVar17 * 2];
            *pfVar24 = afStack_6c[lVar17 * 2 + 1];
            lVar17 = lVar17 + 1;
            pfVar24 = pfVar24 + 2;
          } while (lVar17 != 7);
          pFVar22->prob = fVar2;
          uVar18 = (ulong)((int)uVar18 + 1);
          uVar15 = (ulong)((int)uVar15 - 1);
        }
        iVar14 = (int)uVar15;
      } while ((int)uVar18 <= iVar14);
    }
    if (left_00 < iVar14) {
      qsort_descent_inplace(faceobjects,left_00,iVar14);
      pFVar13 = (faceobjects->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    iVar14 = (int)uVar18;
    uVar18 = uVar18 & 0xffffffff;
  } while (iVar14 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<FaceObject>& faceobjects, int left, int right)
{
    int i = left;
    int j = right;
    float p = faceobjects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (faceobjects[i].prob > p)
            i++;

        while (faceobjects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(faceobjects[i], faceobjects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(faceobjects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(faceobjects, i, right);
        }
    }
}